

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singledocparser.cpp
# Opt level: O0

void __thiscall YAML::SingleDocParser::ParseTag(SingleDocParser *this,string *tag)

{
  ulong uVar1;
  Mark *mark_;
  string *in_RSI;
  Tag tagInfo;
  Token *token;
  Scanner *in_stack_ffffffffffffff20;
  Scanner *this_00;
  Mark *this_01;
  Token *in_stack_ffffffffffffff48;
  Tag *in_stack_ffffffffffffff50;
  undefined1 local_98 [96];
  string local_38 [32];
  Token *local_18;
  string *local_10;
  
  local_10 = in_RSI;
  local_18 = Scanner::peek(in_stack_ffffffffffffff20);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    local_98[0x4b] = 1;
    mark_ = (Mark *)__cxa_allocate_exception(0x40);
    this_01 = &local_18->mark;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_38,"cannot assign multiple tags to the same node",
               (allocator *)(local_98 + 0x5f));
    ParserException::ParserException
              ((ParserException *)this_01,mark_,(string *)in_stack_ffffffffffffff20);
    local_98[0x4b] = 0;
    __cxa_throw(mark_,&ParserException::typeinfo,ParserException::~ParserException);
  }
  this_00 = (Scanner *)local_98;
  Tag::Tag(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  Tag::Translate_abi_cxx11_
            ((Tag *)tagInfo.value.field_2._M_allocated_capacity,
             (Directives *)tagInfo.value._M_string_length);
  std::__cxx11::string::operator=(local_10,(string *)&stack0xffffffffffffff48);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
  Scanner::pop(this_00);
  Tag::~Tag((Tag *)this_00);
  return;
}

Assistant:

void SingleDocParser::ParseTag(std::string& tag) {
  Token& token = m_scanner.peek();
  if (!tag.empty())
    throw ParserException(token.mark, ErrorMsg::MULTIPLE_TAGS);

  Tag tagInfo(token);
  tag = tagInfo.Translate(m_directives);
  m_scanner.pop();
}